

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O2

int Sfm_ObjRef_rec(Sfm_Ntk_t *p,int iObj)

{
  uint __line;
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  char *__assertion;
  int iVar4;
  
  iVar3 = 0;
  if (p->nPis <= iObj) {
    if (p->nObjs <= p->nPos + iObj) {
      __assertion = "Sfm_ObjIsNode(p, iObj)";
      __line = 0x32;
LAB_0040da93:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmWin.c"
                    ,__line,"int Sfm_ObjRef_rec(Sfm_Ntk_t *, int)");
    }
    pVVar2 = Vec_WecEntry(&p->vFanouts,iObj);
    iVar4 = pVVar2->nSize;
    pVVar2->nSize = iVar4 + 1;
    if (iVar4 < 1) {
      if (iVar4 != 0) {
        __assertion = "Value == 1";
        __line = 0x36;
        goto LAB_0040da93;
      }
      iVar3 = 1;
      iVar4 = 0;
      while( true ) {
        iVar1 = Sfm_ObjFaninNum(p,iObj);
        if (iVar1 <= iVar4) break;
        iVar1 = Sfm_ObjFanin(p,iObj,iVar4);
        iVar1 = Sfm_ObjRef_rec(p,iVar1);
        iVar3 = iVar3 + iVar1;
        iVar4 = iVar4 + 1;
      }
    }
  }
  return iVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the MFFC size.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Sfm_ObjRef_rec( Sfm_Ntk_t * p, int iObj )
{
    int i, iFanin, Value, Count;
    if ( Sfm_ObjIsPi(p, iObj) )
        return 0;
    assert( Sfm_ObjIsNode(p, iObj) );
    Value = Sfm_ObjRefIncrement(p, iObj);
    if ( Value > 1 )
        return 0;
    assert( Value == 1 );
    Count = 1;
    Sfm_ObjForEachFanin( p, iObj, iFanin, i )
        Count += Sfm_ObjRef_rec( p, iFanin );
    return Count;
}